

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate_init.inc.c
# Opt level: O1

void gen_spr_74xx(CPUPPCState_conflict2 *env)

{
  undefined8 uVar1;
  undefined8 uVar2;
  
  if (((((env->spr_cb[0x3ff].name == (char *)0x0) && (env->spr[0x3ff] == 0)) &&
       (env->spr_cb[0x3ff].oea_read == (_func_void_DisasContext_ptr_int_int *)0x0)) &&
      ((env->spr_cb[0x3ff].oea_write == (_func_void_DisasContext_ptr_int_int *)0x0 &&
       (env->spr_cb[0x3ff].uea_read == (_func_void_DisasContext_ptr_int_int *)0x0)))) &&
     (env->spr_cb[0x3ff].uea_write == (_func_void_DisasContext_ptr_int_int *)0x0)) {
    env->spr_cb[0x3ff].name = "PIR";
    env->spr_cb[0x3ff].uea_read = spr_noaccess;
    env->spr_cb[0x3ff].uea_write = spr_noaccess;
    env->spr_cb[0x3ff].oea_read = spr_read_generic;
    env->spr_cb[0x3ff].oea_write = spr_write_pir;
    env->spr_cb[0x3ff].hea_read = spr_read_generic;
    env->spr_cb[0x3ff].hea_write = spr_write_pir;
    env->spr_cb[0x3ff].default_value = 0;
    env->spr[0x3ff] = 0;
    if (((env->spr_cb[0x3b0].name == (char *)0x0) && (env->spr[0x3b0] == 0)) &&
       ((env->spr_cb[0x3b0].oea_read == (_func_void_DisasContext_ptr_int_int *)0x0 &&
        (((env->spr_cb[0x3b0].oea_write == (_func_void_DisasContext_ptr_int_int *)0x0 &&
          (env->spr_cb[0x3b0].uea_read == (_func_void_DisasContext_ptr_int_int *)0x0)) &&
         (env->spr_cb[0x3b0].uea_write == (_func_void_DisasContext_ptr_int_int *)0x0)))))) {
      env->spr_cb[0x3b0].name = "MMCR2";
      env->spr_cb[0x3b0].uea_read = spr_noaccess;
      env->spr_cb[0x3b0].uea_write = spr_noaccess;
      env->spr_cb[0x3b0].oea_read = spr_read_generic;
      env->spr_cb[0x3b0].oea_write = spr_write_generic;
      env->spr_cb[0x3b0].hea_read = spr_read_generic;
      env->spr_cb[0x3b0].hea_write = spr_write_generic;
      env->spr_cb[0x3b0].default_value = 0;
      env->spr[0x3b0] = 0;
      if (((env->spr_cb[0x3a0].name == (char *)0x0) && (env->spr[0x3a0] == 0)) &&
         (((env->spr_cb[0x3a0].oea_read == (_func_void_DisasContext_ptr_int_int *)0x0 &&
           ((env->spr_cb[0x3a0].oea_write == (_func_void_DisasContext_ptr_int_int *)0x0 &&
            (env->spr_cb[0x3a0].uea_read == (_func_void_DisasContext_ptr_int_int *)0x0)))) &&
          (env->spr_cb[0x3a0].uea_write == (_func_void_DisasContext_ptr_int_int *)0x0)))) {
        env->spr_cb[0x3a0].name = "UMMCR2";
        env->spr_cb[0x3a0].uea_read = spr_read_ureg;
        env->spr_cb[0x3a0].uea_write = spr_noaccess;
        env->spr_cb[0x3a0].oea_read = spr_read_ureg;
        env->spr_cb[0x3a0].oea_write = spr_noaccess;
        env->spr_cb[0x3a0].hea_read = spr_read_ureg;
        env->spr_cb[0x3a0].hea_write = spr_noaccess;
        env->spr_cb[0x3a0].default_value = 0;
        env->spr[0x3a0] = 0;
        if ((((env->spr_cb[0x3b7].name == (char *)0x0) && (env->spr[0x3b7] == 0)) &&
            (env->spr_cb[0x3b7].oea_read == (_func_void_DisasContext_ptr_int_int *)0x0)) &&
           (((env->spr_cb[0x3b7].oea_write == (_func_void_DisasContext_ptr_int_int *)0x0 &&
             (env->spr_cb[0x3b7].uea_read == (_func_void_DisasContext_ptr_int_int *)0x0)) &&
            (env->spr_cb[0x3b7].uea_write == (_func_void_DisasContext_ptr_int_int *)0x0)))) {
          env->spr_cb[0x3b7].name = "BAMR";
          env->spr_cb[0x3b7].uea_read = spr_noaccess;
          env->spr_cb[0x3b7].uea_write = spr_noaccess;
          env->spr_cb[0x3b7].oea_read = spr_read_generic;
          env->spr_cb[0x3b7].oea_write = spr_write_generic;
          env->spr_cb[0x3b7].hea_read = spr_read_generic;
          env->spr_cb[0x3b7].hea_write = spr_write_generic;
          env->spr_cb[0x3b7].default_value = 0;
          env->spr[0x3b7] = 0;
          if (((env->spr_cb[0x3f6].name == (char *)0x0) && (env->spr[0x3f6] == 0)) &&
             ((env->spr_cb[0x3f6].oea_read == (_func_void_DisasContext_ptr_int_int *)0x0 &&
              (((env->spr_cb[0x3f6].oea_write == (_func_void_DisasContext_ptr_int_int *)0x0 &&
                (env->spr_cb[0x3f6].uea_read == (_func_void_DisasContext_ptr_int_int *)0x0)) &&
               (env->spr_cb[0x3f6].uea_write == (_func_void_DisasContext_ptr_int_int *)0x0)))))) {
            env->spr_cb[0x3f6].name = "MSSCR0";
            env->spr_cb[0x3f6].uea_read = spr_noaccess;
            env->spr_cb[0x3f6].uea_write = spr_noaccess;
            env->spr_cb[0x3f6].oea_read = spr_read_generic;
            env->spr_cb[0x3f6].oea_write = spr_write_generic;
            env->spr_cb[0x3f6].hea_read = spr_read_generic;
            env->spr_cb[0x3f6].hea_write = spr_write_generic;
            env->spr_cb[0x3f6].default_value = 0;
            env->spr[0x3f6] = 0;
            if ((((env->spr_cb[0x3f0].name == (char *)0x0) && (env->spr[0x3f0] == 0)) &&
                ((env->spr_cb[0x3f0].oea_read == (_func_void_DisasContext_ptr_int_int *)0x0 &&
                 ((env->spr_cb[0x3f0].oea_write == (_func_void_DisasContext_ptr_int_int *)0x0 &&
                  (env->spr_cb[0x3f0].uea_read == (_func_void_DisasContext_ptr_int_int *)0x0))))))
               && (env->spr_cb[0x3f0].uea_write == (_func_void_DisasContext_ptr_int_int *)0x0)) {
              env->spr_cb[0x3f0].name = "HID0";
              env->spr_cb[0x3f0].uea_read = spr_noaccess;
              env->spr_cb[0x3f0].uea_write = spr_noaccess;
              env->spr_cb[0x3f0].oea_read = spr_read_generic;
              env->spr_cb[0x3f0].oea_write = spr_write_generic;
              env->spr_cb[0x3f0].hea_read = spr_read_generic;
              env->spr_cb[0x3f0].hea_write = spr_write_generic;
              env->spr_cb[0x3f0].default_value = 0;
              env->spr[0x3f0] = 0;
              if (((((env->spr_cb[0x3f1].name == (char *)0x0) && (env->spr[0x3f1] == 0)) &&
                   (env->spr_cb[0x3f1].oea_read == (_func_void_DisasContext_ptr_int_int *)0x0)) &&
                  ((env->spr_cb[0x3f1].oea_write == (_func_void_DisasContext_ptr_int_int *)0x0 &&
                   (env->spr_cb[0x3f1].uea_read == (_func_void_DisasContext_ptr_int_int *)0x0)))) &&
                 (env->spr_cb[0x3f1].uea_write == (_func_void_DisasContext_ptr_int_int *)0x0)) {
                env->spr_cb[0x3f1].name = "HID1";
                env->spr_cb[0x3f1].uea_read = spr_noaccess;
                env->spr_cb[0x3f1].uea_write = spr_noaccess;
                env->spr_cb[0x3f1].oea_read = spr_read_generic;
                env->spr_cb[0x3f1].oea_write = spr_write_generic;
                env->spr_cb[0x3f1].hea_read = spr_read_generic;
                env->spr_cb[0x3f1].hea_write = spr_write_generic;
                env->spr_cb[0x3f1].default_value = 0;
                env->spr[0x3f1] = 0;
                if (((env->spr_cb[0x100].name == (char *)0x0) && (env->spr[0x100] == 0)) &&
                   ((env->spr_cb[0x100].oea_read == (_func_void_DisasContext_ptr_int_int *)0x0 &&
                    (((env->spr_cb[0x100].oea_write == (_func_void_DisasContext_ptr_int_int *)0x0 &&
                      (env->spr_cb[0x100].uea_read == (_func_void_DisasContext_ptr_int_int *)0x0))
                     && (env->spr_cb[0x100].uea_write == (_func_void_DisasContext_ptr_int_int *)0x0)
                     ))))) {
                  env->spr_cb[0x100].name = "VRSAVE";
                  env->spr_cb[0x100].uea_read = spr_read_generic;
                  env->spr_cb[0x100].uea_write = spr_write_generic;
                  env->spr_cb[0x100].oea_read = spr_read_generic;
                  env->spr_cb[0x100].oea_write = spr_write_generic;
                  env->spr_cb[0x100].hea_read = spr_read_generic;
                  env->spr_cb[0x100].hea_write = spr_write_generic;
                  env->spr_cb[0x100].default_value = 0;
                  env->spr[0x100] = 0;
                  if (((env->spr_cb[0x3f9].name == (char *)0x0) && (env->spr[0x3f9] == 0)) &&
                     (((env->spr_cb[0x3f9].oea_read == (_func_void_DisasContext_ptr_int_int *)0x0 &&
                       ((env->spr_cb[0x3f9].oea_write == (_func_void_DisasContext_ptr_int_int *)0x0
                        && (env->spr_cb[0x3f9].uea_read ==
                            (_func_void_DisasContext_ptr_int_int *)0x0)))) &&
                      (env->spr_cb[0x3f9].uea_write == (_func_void_DisasContext_ptr_int_int *)0x0)))
                     ) {
                    env->spr_cb[0x3f9].name = "L2CR";
                    env->spr_cb[0x3f9].uea_read = spr_noaccess;
                    env->spr_cb[0x3f9].uea_write = spr_noaccess;
                    env->spr_cb[0x3f9].oea_read = spr_read_generic;
                    env->spr_cb[0x3f9].oea_write = spr_access_nop;
                    env->spr_cb[0x3f9].hea_read = spr_read_generic;
                    env->spr_cb[0x3f9].hea_write = spr_access_nop;
                    env->spr_cb[0x3f9].default_value = 0;
                    env->spr[0x3f9] = 0;
                    (env->vec_status).float_rounding_mode = '\0';
                    helper_mtvscr_ppc64(env,0x10000);
                    return;
                  }
                  uVar2 = 0x3f9;
                  uVar1 = 0x3f9;
                }
                else {
                  uVar2 = 0x100;
                  uVar1 = 0x100;
                }
              }
              else {
                uVar2 = 0x3f1;
                uVar1 = 0x3f1;
              }
            }
            else {
              uVar2 = 0x3f0;
              uVar1 = 0x3f0;
            }
          }
          else {
            uVar2 = 0x3f6;
            uVar1 = 0x3f6;
          }
        }
        else {
          uVar2 = 0x3b7;
          uVar1 = 0x3b7;
        }
      }
      else {
        uVar2 = 0x3a0;
        uVar1 = 0x3a0;
      }
    }
    else {
      uVar2 = 0x3b0;
      uVar1 = 0x3b0;
    }
  }
  else {
    uVar2 = 0x3ff;
    uVar1 = 0x3ff;
  }
  printf("Error: Trying to register SPR %d (%03x) twice !\n",uVar2,uVar1);
  exit(1);
}

Assistant:

static void gen_spr_74xx(CPUPPCState *env)
{
    /* Processor identification */
    spr_register(env, SPR_PIR, "PIR",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_generic, &spr_write_pir,
                 0x00000000);
    /* XXX : not implemented */
    spr_register(env, SPR_74XX_MMCR2, "MMCR2",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_generic, &spr_write_generic,
                 0x00000000);
    /* XXX : not implemented */
    spr_register(env, SPR_74XX_UMMCR2, "UMMCR2",
                 &spr_read_ureg, SPR_NOACCESS,
                 &spr_read_ureg, SPR_NOACCESS,
                 0x00000000);
    /* XXX: not implemented */
    spr_register(env, SPR_BAMR, "BAMR",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_generic, &spr_write_generic,
                 0x00000000);
    /* XXX : not implemented */
    spr_register(env, SPR_MSSCR0, "MSSCR0",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_generic, &spr_write_generic,
                 0x00000000);
    /* Hardware implementation registers */
    /* XXX : not implemented */
    spr_register(env, SPR_HID0, "HID0",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_generic, &spr_write_generic,
                 0x00000000);
    /* XXX : not implemented */
    spr_register(env, SPR_HID1, "HID1",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_generic, &spr_write_generic,
                 0x00000000);
    /* Altivec */
    spr_register(env, SPR_VRSAVE, "VRSAVE",
                 &spr_read_generic, &spr_write_generic,
                 &spr_read_generic, &spr_write_generic,
                 0x00000000);
    /* XXX : not implemented */
    spr_register(env, SPR_L2CR, "L2CR",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_generic, spr_access_nop,
                 0x00000000);
    /* Not strictly an SPR */
    vscr_init(env, 0x00010000);
}